

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

char * get_quoted_string(char **string,size_t *output_string_len)

{
  char *pcVar1;
  JSON_Status JVar2;
  JSON_Status status;
  size_t input_string_len;
  char *string_start;
  size_t *output_string_len_local;
  char **string_local;
  
  pcVar1 = *string;
  JVar2 = skip_quotes(string);
  if (JVar2 == 0) {
    string_local = (char **)process_string(pcVar1 + 1,(size_t)(*string + (-2 - (long)pcVar1)),
                                           output_string_len);
  }
  else {
    string_local = (char **)0x0;
  }
  return (char *)string_local;
}

Assistant:

static char * get_quoted_string(const char **string, size_t *output_string_len) {
    const char *string_start = *string;
    size_t input_string_len = 0;
    JSON_Status status = skip_quotes(string);
    if (status != JSONSuccess) {
        return NULL;
    }
    input_string_len = *string - string_start - 2; /* length without quotes */
    return process_string(string_start + 1, input_string_len, output_string_len);
}